

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O3

void __thiscall xmrig::SelfSelectClient::onHttpData(SelfSelectClient *this)

{
  HttpData *in_RSI;
  
  onHttpData((SelfSelectClient *)&this[-1].m_retryPause,in_RSI);
  return;
}

Assistant:

void xmrig::SelfSelectClient::onHttpData(const HttpData &data)
{
    if (data.status != HTTP_STATUS_OK) {
        return retry();
    }

    LOG_DEBUG("[%s] received (%d bytes): \"%.*s\"", pool().daemon().url().data(), static_cast<int>(data.body.size()), static_cast<int>(data.body.size()), data.body.c_str());

    rapidjson::Document doc;
    if (doc.Parse(data.body.c_str()).HasParseError()) {
        if (!isQuiet()) {
            LOG_ERR("[%s] JSON decode failed: \"%s\"",  pool().daemon().url().data(), rapidjson::GetParseError_En(doc.GetParseError()));
        }

        return retry();
    }

    const int64_t id = Json::getInt64(doc, "id", -1);
    if (id > 0 && m_sequence - id != 1) {
        return;
    }

    if (!parseResponse(id, doc["result"], Json::getObject(doc, "error"))) {
        retry();
    }
}